

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O0

DLword compute_lisp_hash(char *char_base,DLword offset,DLword length,DLword fatp)

{
  char *local_30;
  DLword *word_base;
  ushort local_20;
  DLword temp1;
  DLword number;
  DLword hash;
  DLword fatp_local;
  DLword length_local;
  DLword offset_local;
  char *char_base_local;
  
  if (length == 0) {
    char_base_local._6_2_ = 0;
  }
  else {
    if (fatp == 0) {
      _hash = char_base + (int)(uint)offset;
      local_20 = (ushort)*(byte *)((ulong)_hash ^ 3) << 8;
      for (word_base._6_2_ = 1; _hash = _hash + 1, (int)(uint)word_base._6_2_ <= (int)(length - 1);
          word_base._6_2_ = word_base._6_2_ + 1) {
        local_20 = (local_20 + (local_20 & 0xfff) * 4) * 0x101 + (ushort)*(byte *)((ulong)_hash ^ 3)
        ;
      }
    }
    else {
      local_30 = char_base + (long)(int)(uint)offset * 2;
      local_20 = *(short *)((ulong)local_30 ^ 2) << 8;
      for (word_base._6_2_ = 1; local_30 = local_30 + 2,
          (int)(uint)word_base._6_2_ <= (int)(length - 1); word_base._6_2_ = word_base._6_2_ + 1) {
        local_20 = (local_20 + (local_20 & 0xfff) * 4) * 0x101 +
                   (*(ushort *)((ulong)local_30 ^ 2) & 0xff);
      }
    }
    char_base_local._6_2_ = local_20;
  }
  return char_base_local._6_2_;
}

Assistant:

DLword compute_lisp_hash(const char *char_base, DLword offset, DLword length, DLword fatp) {
  DLword hash;
  DLword number;
  DLword temp1;
  const DLword *word_base;

  if (length == 0) return (0);

  if (fatp) { /* fat characters in the string to be searched. */
    word_base = (const DLword *)char_base;
    word_base += offset;
    hash = (DLword)((0xFF & GETWORD(word_base)) << 8); /* get first byte */
    word_base++;                                     /* skip length area */

    for (number = 1; number <= length - 1; word_base++, number++) {
      hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
      temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
      hash = (temp1 + (0xFF & GETWORD(word_base))) & 0x0ffff;
    }
  } else {
    char_base += offset;
    hash = (DLword)((0xFF & GETBYTE(char_base)) << 8); /* get first byte */
    char_base++;                                  /* skip length area */

    for (number = 1; number <= length - 1; char_base++, number++) {
      hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
      temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
      hash = (temp1 + (0xFF & GETBYTE(char_base))) & 0x0ffff;
    }
  }
  return (hash);

}